

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

void Abc_NtkSetCiArrivalTime(void *pAbc0,int iCi,float Rise,float Fall)

{
  Abc_Ntk_t *pNtk;
  char *__s;
  
  if (pAbc0 == (void *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start()";
  }
  else {
    pNtk = Abc_FrameReadNtk((Abc_Frame_t *)pAbc0);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      __s = "Current network in ABC framework is not defined.";
    }
    else {
      if ((-1 < iCi) && (iCi < pNtk->vCis->nSize)) {
        Abc_NtkTimeSetArrival(pNtk,*(int *)((long)pNtk->vCis->pArray[(uint)iCi] + 0x10),Rise,Fall);
        return;
      }
      __s = "CI index is not valid.";
    }
  }
  puts(__s);
  return;
}

Assistant:

void Abc_NtkSetCiArrivalTime( void * pAbc0, int iCi, float Rise, float Fall )
{
    Abc_Frame_t * pAbc = (Abc_Frame_t *)pAbc0;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    if ( pAbc == NULL )
    {
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
        return;
    }
    pNtk = Abc_FrameReadNtk( pAbc );
    if ( pNtk == NULL )
    {
        printf( "Current network in ABC framework is not defined.\n" );
        return;
    }
    if ( iCi < 0 || iCi >= Abc_NtkCiNum(pNtk) )
    {
        printf( "CI index is not valid.\n" );
        return;
    }
    pNode = Abc_NtkCi( pNtk, iCi );
    Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pNode), Rise, Fall );
}